

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void Cmd_cmdlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pattern;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pattern_00;
  int count;
  long lVar4;
  char acStack_48 [24];
  
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 == 1) {
    pattern = (char *)0x0;
    pattern_00 = extraout_RDX;
  }
  else {
    pattern = FCommandLine::operator[](argv,1);
    pattern_00 = extraout_RDX_00;
  }
  lVar4 = 0xc;
  iVar2 = 0;
  do {
    if (lVar4 == 0x30c) {
      iVar3 = DumpHash((FConsoleCommand **)0x0,SUB81(pattern,0),pattern_00);
      Printf("%d commands\n",(ulong)(uint)(iVar2 + iVar3));
      return;
    }
    if (pattern == (char *)0x0) {
LAB_00376df4:
      Printf("+%s\n",ActionMaps[0].Name + lVar4 + -0xc);
      iVar2 = iVar2 + 1;
      if (pattern != (char *)0x0) goto LAB_00376e0d;
LAB_00376e34:
      Printf("-%s\n",ActionMaps[0].Name + lVar4 + -0xc);
      iVar2 = iVar2 + 1;
      pattern_00 = extraout_RDX_02;
    }
    else {
      mysnprintf(acStack_48,0x10,"+%s",ActionMaps[0].Name + lVar4 + -0xc);
      bVar1 = CheckWildcards(pattern,acStack_48);
      if (bVar1) goto LAB_00376df4;
LAB_00376e0d:
      mysnprintf(acStack_48,0x10,"-%s",ActionMaps[0].Name + lVar4 + -0xc);
      bVar1 = CheckWildcards(pattern,acStack_48);
      pattern_00 = extraout_RDX_01;
      if (bVar1) goto LAB_00376e34;
    }
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

CCMD (cmdlist)
{
	int count;
	const char *filter = (argv.argc() == 1 ? NULL : argv[1]);

	count = ListActionCommands (filter);
	count += DumpHash (Commands, false, filter);
	Printf ("%d commands\n", count);
}